

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,Cord *cord,CordBuffer *buffer,size_t size_hint)

{
  byte bVar1;
  CordRepFlat *pCVar2;
  CordRep *pCVar3;
  void *pvVar4;
  ulong uVar5;
  sbyte sVar6;
  ulong uVar7;
  sbyte sVar8;
  int iVar9;
  int iVar10;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_01915b48;
  pCVar3 = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (cord->contents_).data_.rep_.field_0.as_tree.cordz_info;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.rep = pCVar3;
  (cord->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (cord->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  this->size_hint_ = size_hint;
  bVar1 = (buffer->rep_).field_0.short_rep.raw_size;
  if ((bVar1 & 1) == 0) {
    pCVar2 = (buffer->rep_).field_0.long_rep.rep;
    bVar1 = (pCVar2->super_CordRep).tag;
    sVar8 = 0xc;
    if (bVar1 < 0xbb) {
      sVar8 = 6;
    }
    iVar10 = -0xb800d;
    if (bVar1 < 0xbb) {
      iVar10 = -0xe8d;
    }
    sVar6 = 3;
    if (0x42 < bVar1) {
      sVar6 = sVar8;
    }
    iVar9 = -0x1d;
    if (0x42 < bVar1) {
      iVar9 = iVar10;
    }
    uVar5 = (pCVar2->super_CordRep).length;
    uVar7 = (ulong)(int)(((uint)bVar1 << sVar6) + iVar9);
  }
  else {
    uVar5 = (ulong)((char)bVar1 >> 1);
    uVar7 = 0xf;
  }
  this->state_ = (uVar5 < uVar7) + kFull;
  pvVar4 = (buffer->rep_).field_0.long_rep.padding;
  (this->buffer_).rep_.field_0.long_rep.rep = (buffer->rep_).field_0.long_rep.rep;
  (this->buffer_).rep_.field_0.long_rep.padding = pvVar4;
  (buffer->rep_).field_0.short_rep.raw_size = '\x01';
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::Cord cord, absl::CordBuffer buffer,
                                   size_t size_hint)
    : cord_(std::move(cord)),
      size_hint_(size_hint),
      state_(buffer.length() < buffer.capacity() ? State::kPartial
                                                 : State::kFull),
      buffer_(std::move(buffer)) {}